

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_twod_normal(REF_GRID ref_grid,REF_INT node,REF_DBL *normal)

{
  uint uVar1;
  REF_STATUS local_64;
  REF_INT local_60;
  int local_5c;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell;
  REF_INT item;
  REF_DBL seg_normal [3];
  REF_CELL ref_cell;
  REF_DBL *normal_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  seg_normal[2] = (REF_DBL)ref_grid->cell[0];
  *normal = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  if ((node < 0) || (((REF_CELL)seg_normal[2])->ref_adj->nnode <= node)) {
    local_5c = -1;
  }
  else {
    local_5c = ((REF_CELL)seg_normal[2])->ref_adj->first[node];
  }
  ref_private_macro_code_rss = local_5c;
  if (local_5c == -1) {
    local_60 = -1;
  }
  else {
    local_60 = ((REF_CELL)seg_normal[2])->ref_adj->item[local_5c].ref;
  }
  ref_private_macro_code_rss_1 = local_60;
  while( true ) {
    if (ref_private_macro_code_rss == -1) {
      ref_grid_local._4_4_ = ref_math_normalize(normal);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x214,"ref_layer_twod_normal",(ulong)ref_grid_local._4_4_,"norm");
      }
      return ref_grid_local._4_4_;
    }
    uVar1 = ref_layer_interior_seg_normal(ref_grid,ref_private_macro_code_rss_1,(REF_DBL *)&cell);
    if (uVar1 != 0) break;
    *normal = _cell + *normal;
    normal[1] = seg_normal[0] + normal[1];
    normal[2] = seg_normal[1] + normal[2];
    ref_private_macro_code_rss =
         *(int *)(*(long *)(*(long *)((long)seg_normal[2] + 0x40) + 0x10) +
                 (long)ref_private_macro_code_rss * 8);
    if (ref_private_macro_code_rss == -1) {
      local_64 = -1;
    }
    else {
      local_64 = *(REF_STATUS *)
                  (*(long *)(*(long *)((long)seg_normal[2] + 0x40) + 0x10) + 4 +
                  (long)ref_private_macro_code_rss * 8);
    }
    ref_private_macro_code_rss_1 = local_64;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x20f,
         "ref_layer_twod_normal",(ulong)uVar1,"normal");
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_layer_twod_normal(REF_GRID ref_grid, REF_INT node,
                                                REF_DBL *normal) {
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_DBL seg_normal[3];
  REF_INT item, cell;
  normal[0] = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_layer_interior_seg_normal(ref_grid, cell, seg_normal), "normal");
    normal[0] += seg_normal[0];
    normal[1] += seg_normal[1];
    normal[2] += seg_normal[2];
  }
  RSS(ref_math_normalize(normal), "norm");
  return REF_SUCCESS;
}